

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::SourceCodeInfo::SourceCodeInfo(SourceCodeInfo *this,SourceCodeInfo *from)

{
  void *pvVar1;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_007300c0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->location_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->location_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->location_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->location_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
            (&(this->location_).super_RepeatedPtrFieldBase,
             &(from->location_).super_RepeatedPtrFieldBase);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

SourceCodeInfo::SourceCodeInfo(const SourceCodeInfo& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      location_(from.location_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:google.protobuf.SourceCodeInfo)
}